

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void attachFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  uint uVar1;
  sqlite3 *db;
  Db *pDVar2;
  Btree *pBVar3;
  char *pcVar4;
  Btree *pBVar5;
  Schema *pSVar6;
  bool bVar7;
  u8 uVar8;
  undefined6 uVar9;
  u8 uVar10;
  u8 uVar11;
  undefined6 uVar12;
  sqlite3_context *pCtx;
  int iVar13;
  int iVar14;
  uchar *puVar15;
  uchar *z;
  Db *pDVar16;
  char *pcVar17;
  Schema *pSVar18;
  ulong uVar19;
  long lVar20;
  char *zErrDyn;
  uint flags;
  sqlite3_context *local_58;
  uchar *local_50;
  char *zErr;
  char *zPath;
  sqlite3_vfs *pVfs;
  
  db = context->pOut->db;
  zPath = (char *)0x0;
  zErr = (char *)0x0;
  zErrDyn = (char *)0x0;
  puVar15 = sqlite3_value_text(*argv);
  z = sqlite3_value_text(argv[1]);
  if (puVar15 == (uchar *)0x0) {
    puVar15 = "";
  }
  if (z == (uchar *)0x0) {
    z = "";
  }
  uVar1 = db->nDb;
  if ((int)uVar1 < db->aLimit[7] + 2) {
    uVar19 = 0;
    if (0 < (int)uVar1) {
      uVar19 = (ulong)uVar1;
    }
    pDVar16 = db->aDb;
    lVar20 = 0;
    local_58 = context;
    local_50 = puVar15;
    do {
      pCtx = local_58;
      if (uVar19 * 0x20 + 0x20 == lVar20 + 0x20) {
        if (pDVar16 == db->aDbStatic) {
          pDVar16 = (Db *)sqlite3DbMallocRawNN(db,0x60);
          if (pDVar16 == (Db *)0x0) {
            return;
          }
          pDVar2 = db->aDb;
          pcVar4 = pDVar2->zDbSName;
          pBVar3 = pDVar2->pBt;
          uVar10 = pDVar2->safety_level;
          uVar11 = pDVar2->bSyncSet;
          uVar12 = *(undefined6 *)&pDVar2->field_0x12;
          pSVar18 = pDVar2->pSchema;
          pcVar17 = pDVar2[1].zDbSName;
          pBVar5 = pDVar2[1].pBt;
          uVar8 = pDVar2[1].bSyncSet;
          uVar9 = *(undefined6 *)&pDVar2[1].field_0x12;
          pSVar6 = pDVar2[1].pSchema;
          pDVar16[1].safety_level = pDVar2[1].safety_level;
          pDVar16[1].bSyncSet = uVar8;
          *(undefined6 *)&pDVar16[1].field_0x12 = uVar9;
          pDVar16[1].pSchema = pSVar6;
          pDVar16[1].zDbSName = pcVar17;
          pDVar16[1].pBt = pBVar5;
          pDVar16->safety_level = uVar10;
          pDVar16->bSyncSet = uVar11;
          *(undefined6 *)&pDVar16->field_0x12 = uVar12;
          pDVar16->pSchema = pSVar18;
          pDVar16->zDbSName = pcVar4;
          pDVar16->pBt = pBVar3;
        }
        else {
          pDVar16 = (Db *)sqlite3DbRealloc(db,pDVar16,(long)(int)uVar1 * 0x20 + 0x20);
          if (pDVar16 == (Db *)0x0) {
            return;
          }
        }
        db->aDb = pDVar16;
        iVar13 = db->nDb;
        pDVar2 = pDVar16 + iVar13;
        pDVar2->safety_level = '\0';
        pDVar2->bSyncSet = '\0';
        *(undefined6 *)&pDVar2->field_0x12 = 0;
        *(Schema **)(&pDVar2->safety_level + 8) = (Schema *)0x0;
        pDVar16[iVar13].zDbSName = (char *)0x0;
        pDVar16[iVar13].pBt = (Btree *)0x0;
        flags = db->openFlags;
        iVar14 = sqlite3ParseUri(db->pVfs->zName,(char *)local_50,&flags,&pVfs,&zPath,&zErr);
        pcVar4 = zPath;
        if (iVar14 != 0) {
          if (iVar14 == 7) {
            sqlite3OomFault(db);
          }
          pcVar4 = zErr;
          sqlite3_result_error(pCtx,zErr,-1);
          sqlite3_free(pcVar4);
          return;
        }
        pDVar16 = pDVar16 + iVar13;
        flags = flags | 0x100;
        iVar13 = sqlite3BtreeOpen(pVfs,zPath,db,&pDVar16->pBt,0,flags);
        db->nDb = db->nDb + 1;
        pcVar17 = sqlite3DbStrDup(db,(char *)z);
        pDVar16->zDbSName = pcVar17;
        db->noSharedCache = '\0';
        if (iVar13 == 0) {
          pSVar18 = sqlite3SchemaGet(db,pDVar16->pBt);
          pDVar16->pSchema = pSVar18;
          iVar13 = 0;
          if (pSVar18 == (Schema *)0x0) {
            iVar13 = 7;
            bVar7 = false;
          }
          else {
            bVar7 = true;
            if ((pSVar18->file_format != '\0') && (pSVar18->enc != db->enc)) {
              bVar7 = false;
              zErrDyn = sqlite3MPrintf(db,
                                       "attached databases must use the same text encoding as main database"
                                      );
              iVar13 = 1;
            }
          }
          sqlite3BtreeEnter(pDVar16->pBt);
          sqlite3PagerLockingMode(pDVar16->pBt->pBt->pPager,(uint)db->dfltLockMode);
          pBVar3 = pDVar16->pBt;
          iVar14 = sqlite3BtreeSecureDelete(db->aDb->pBt,-1);
          sqlite3BtreeSecureDelete(pBVar3,iVar14);
          sqlite3BtreeSetPagerFlags(pDVar16->pBt,(uint)db->flags & 0x38 | 3);
          sqlite3BtreeLeave(pDVar16->pBt);
          pDVar16->safety_level = '\x03';
          if ((bVar7) && (iVar13 = 7, pDVar16->zDbSName != (char *)0x0)) {
            iVar13 = 0;
          }
        }
        else {
          if (iVar13 == 0x13) {
            zErrDyn = sqlite3MPrintf(db,"database is already attached");
            iVar13 = 1;
          }
          pDVar16->safety_level = '\x03';
        }
        sqlite3_free(pcVar4);
        if (iVar13 == 0) {
          sqlite3BtreeEnterAll(db);
          (db->init).iDb = '\0';
          *(byte *)&db->mDbFlags = (byte)db->mDbFlags & 0xef;
          iVar13 = sqlite3Init(db,&zErrDyn);
          sqlite3BtreeLeaveAll(db);
          if (iVar13 == 0) {
            return;
          }
        }
        lVar20 = (long)db->nDb + -1;
        pBVar3 = db->aDb[lVar20].pBt;
        if (pBVar3 != (Btree *)0x0) {
          sqlite3BtreeClose(pBVar3);
          pDVar16 = db->aDb;
          pDVar16[lVar20].pBt = (Btree *)0x0;
          pDVar16[lVar20].pSchema = (Schema *)0x0;
        }
        sqlite3ResetAllSchemasOfConnection(db);
        context = local_58;
        db->nDb = (int)lVar20;
        if ((iVar13 == 0xc0a) || (iVar13 == 7)) {
          sqlite3OomFault(db);
          sqlite3DbFree(db,zErrDyn);
          zErrDyn = sqlite3MPrintf(db,"out of memory");
          context = local_58;
        }
        else {
          if (zErrDyn != (char *)0x0) goto LAB_00180e42;
          zErrDyn = sqlite3MPrintf(db,"unable to open database: %s",local_50);
        }
        goto LAB_00180e3d;
      }
      iVar13 = sqlite3StrICmp(*(char **)((long)&pDVar16->zDbSName + lVar20),(char *)z);
      lVar20 = lVar20 + 0x20;
    } while (iVar13 != 0);
    iVar13 = 0;
    zErrDyn = sqlite3MPrintf(db,"database %s is already in use",z);
    context = local_58;
  }
  else {
    iVar13 = 0;
    zErrDyn = sqlite3MPrintf(db,"too many attached databases - max %d");
  }
LAB_00180e3d:
  if (zErrDyn != (char *)0x0) {
LAB_00180e42:
    sqlite3_result_error(context,zErrDyn,-1);
    sqlite3DbFree(db,zErrDyn);
  }
  if (iVar13 != 0) {
    sqlite3_result_error_code(context,iVar13);
  }
  return;
}

Assistant:

static void attachFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  int i;
  int rc = 0;
  sqlite3 *db = sqlite3_context_db_handle(context);
  const char *zName;
  const char *zFile;
  char *zPath = 0;
  char *zErr = 0;
  unsigned int flags;
  Db *aNew;                 /* New array of Db pointers */
  Db *pNew;                 /* Db object for the newly attached database */
  char *zErrDyn = 0;
  sqlite3_vfs *pVfs;

  UNUSED_PARAMETER(NotUsed);
  zFile = (const char *)sqlite3_value_text(argv[0]);
  zName = (const char *)sqlite3_value_text(argv[1]);
  if( zFile==0 ) zFile = "";
  if( zName==0 ) zName = "";

#ifdef SQLITE_ENABLE_DESERIALIZE
# define REOPEN_AS_MEMDB(db)  (db->init.reopenMemdb)
#else
# define REOPEN_AS_MEMDB(db)  (0)
#endif

  if( REOPEN_AS_MEMDB(db) ){
    /* This is not a real ATTACH.  Instead, this routine is being called
    ** from sqlite3_deserialize() to close database db->init.iDb and
    ** reopen it as a MemDB */
    pVfs = sqlite3_vfs_find("memdb");
    if( pVfs==0 ) return;
    pNew = &db->aDb[db->init.iDb];
    if( pNew->pBt ) sqlite3BtreeClose(pNew->pBt);
    pNew->pBt = 0;
    pNew->pSchema = 0;
    rc = sqlite3BtreeOpen(pVfs, "x\0", db, &pNew->pBt, 0, SQLITE_OPEN_MAIN_DB);
  }else{
    /* This is a real ATTACH
    **
    ** Check for the following errors:
    **
    **     * Too many attached databases,
    **     * Transaction currently open
    **     * Specified database name already being used.
    */
    if( db->nDb>=db->aLimit[SQLITE_LIMIT_ATTACHED]+2 ){
      zErrDyn = sqlite3MPrintf(db, "too many attached databases - max %d", 
        db->aLimit[SQLITE_LIMIT_ATTACHED]
      );
      goto attach_error;
    }
    for(i=0; i<db->nDb; i++){
      char *z = db->aDb[i].zDbSName;
      assert( z && zName );
      if( sqlite3StrICmp(z, zName)==0 ){
        zErrDyn = sqlite3MPrintf(db, "database %s is already in use", zName);
        goto attach_error;
      }
    }
  
    /* Allocate the new entry in the db->aDb[] array and initialize the schema
    ** hash tables.
    */
    if( db->aDb==db->aDbStatic ){
      aNew = sqlite3DbMallocRawNN(db, sizeof(db->aDb[0])*3 );
      if( aNew==0 ) return;
      memcpy(aNew, db->aDb, sizeof(db->aDb[0])*2);
    }else{
      aNew = sqlite3DbRealloc(db, db->aDb, sizeof(db->aDb[0])*(db->nDb+1) );
      if( aNew==0 ) return;
    }
    db->aDb = aNew;
    pNew = &db->aDb[db->nDb];
    memset(pNew, 0, sizeof(*pNew));
  
    /* Open the database file. If the btree is successfully opened, use
    ** it to obtain the database schema. At this point the schema may
    ** or may not be initialized.
    */
    flags = db->openFlags;
    rc = sqlite3ParseUri(db->pVfs->zName, zFile, &flags, &pVfs, &zPath, &zErr);
    if( rc!=SQLITE_OK ){
      if( rc==SQLITE_NOMEM ) sqlite3OomFault(db);
      sqlite3_result_error(context, zErr, -1);
      sqlite3_free(zErr);
      return;
    }
    assert( pVfs );
    flags |= SQLITE_OPEN_MAIN_DB;
    rc = sqlite3BtreeOpen(pVfs, zPath, db, &pNew->pBt, 0, flags);
    db->nDb++;
    pNew->zDbSName = sqlite3DbStrDup(db, zName);
  }
  db->noSharedCache = 0;
  if( rc==SQLITE_CONSTRAINT ){
    rc = SQLITE_ERROR;
    zErrDyn = sqlite3MPrintf(db, "database is already attached");
  }else if( rc==SQLITE_OK ){
    Pager *pPager;
    pNew->pSchema = sqlite3SchemaGet(db, pNew->pBt);
    if( !pNew->pSchema ){
      rc = SQLITE_NOMEM_BKPT;
    }else if( pNew->pSchema->file_format && pNew->pSchema->enc!=ENC(db) ){
      zErrDyn = sqlite3MPrintf(db, 
        "attached databases must use the same text encoding as main database");
      rc = SQLITE_ERROR;
    }
    sqlite3BtreeEnter(pNew->pBt);
    pPager = sqlite3BtreePager(pNew->pBt);
    sqlite3PagerLockingMode(pPager, db->dfltLockMode);
    sqlite3BtreeSecureDelete(pNew->pBt,
                             sqlite3BtreeSecureDelete(db->aDb[0].pBt,-1) );
#ifndef SQLITE_OMIT_PAGER_PRAGMAS
    sqlite3BtreeSetPagerFlags(pNew->pBt,
                      PAGER_SYNCHRONOUS_FULL | (db->flags & PAGER_FLAGS_MASK));
#endif
    sqlite3BtreeLeave(pNew->pBt);
  }
  pNew->safety_level = SQLITE_DEFAULT_SYNCHRONOUS+1;
  if( rc==SQLITE_OK && pNew->zDbSName==0 ){
    rc = SQLITE_NOMEM_BKPT;
  }


#ifdef SQLITE_HAS_CODEC
  if( rc==SQLITE_OK ){
    extern int sqlite3CodecAttach(sqlite3*, int, const void*, int);
    extern void sqlite3CodecGetKey(sqlite3*, int, void**, int*);
    int nKey;
    char *zKey;
    int t = sqlite3_value_type(argv[2]);
    switch( t ){
      case SQLITE_INTEGER:
      case SQLITE_FLOAT:
        zErrDyn = sqlite3DbStrDup(db, "Invalid key value");
        rc = SQLITE_ERROR;
        break;
        
      case SQLITE_TEXT:
      case SQLITE_BLOB:
        nKey = sqlite3_value_bytes(argv[2]);
        zKey = (char *)sqlite3_value_blob(argv[2]);
        rc = sqlite3CodecAttach(db, db->nDb-1, zKey, nKey);
        break;

      case SQLITE_NULL:
        /* No key specified.  Use the key from URI filename, or if none,
        ** use the key from the main database. */
        if( sqlite3CodecQueryParameters(db, zName, zPath)==0 ){
          sqlite3CodecGetKey(db, 0, (void**)&zKey, &nKey);
          if( nKey || sqlite3BtreeGetOptimalReserve(db->aDb[0].pBt)>0 ){
            rc = sqlite3CodecAttach(db, db->nDb-1, zKey, nKey);
          }
        }
        break;
    }
  }
#endif
  sqlite3_free( zPath );

  /* If the file was opened successfully, read the schema for the new database.
  ** If this fails, or if opening the file failed, then close the file and 
  ** remove the entry from the db->aDb[] array. i.e. put everything back the
  ** way we found it.
  */
  if( rc==SQLITE_OK ){
    sqlite3BtreeEnterAll(db);
    db->init.iDb = 0;
    db->mDbFlags &= ~(DBFLAG_SchemaKnownOk);
    if( !REOPEN_AS_MEMDB(db) ){
      rc = sqlite3Init(db, &zErrDyn);
    }
    sqlite3BtreeLeaveAll(db);
    assert( zErrDyn==0 || rc!=SQLITE_OK );
  }
#ifdef SQLITE_USER_AUTHENTICATION
  if( rc==SQLITE_OK && !REOPEN_AS_MEMDB(db) ){
    u8 newAuth = 0;
    rc = sqlite3UserAuthCheckLogin(db, zName, &newAuth);
    if( newAuth<db->auth.authLevel ){
      rc = SQLITE_AUTH_USER;
    }
  }
#endif
  if( rc ){
    if( !REOPEN_AS_MEMDB(db) ){
      int iDb = db->nDb - 1;
      assert( iDb>=2 );
      if( db->aDb[iDb].pBt ){
        sqlite3BtreeClose(db->aDb[iDb].pBt);
        db->aDb[iDb].pBt = 0;
        db->aDb[iDb].pSchema = 0;
      }
      sqlite3ResetAllSchemasOfConnection(db);
      db->nDb = iDb;
      if( rc==SQLITE_NOMEM || rc==SQLITE_IOERR_NOMEM ){
        sqlite3OomFault(db);
        sqlite3DbFree(db, zErrDyn);
        zErrDyn = sqlite3MPrintf(db, "out of memory");
      }else if( zErrDyn==0 ){
        zErrDyn = sqlite3MPrintf(db, "unable to open database: %s", zFile);
      }
    }
    goto attach_error;
  }
  
  return;

attach_error:
  /* Return an error if we get here */
  if( zErrDyn ){
    sqlite3_result_error(context, zErrDyn, -1);
    sqlite3DbFree(db, zErrDyn);
  }
  if( rc ) sqlite3_result_error_code(context, rc);
}